

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O1

int AF_A_KoraxChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  AActor *pAVar9;
  AActor **ppAVar10;
  AActor *pAVar11;
  VMValue *pVVar12;
  char *__assertion;
  bool bVar13;
  FSoundID local_6c;
  DAngle local_68;
  DAngle local_60;
  DVector3 local_58;
  DVector3 local_40;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bc7f6;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_005bc7cb:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005bc7f6:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                  ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  pVVar12 = param;
  uVar6 = numparam;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar8 = (this->super_DThinker).super_DObject.Class;
    bVar13 = pPVar8 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar13;
    uVar6 = (uint)bVar13;
    pVVar12 = (VMValue *)(ulong)(pPVar8 == pPVar3 || bVar13);
    if (pPVar8 != pPVar3 && !bVar13) {
      do {
        pPVar8 = pPVar8->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
        if (pPVar8 == pPVar3) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bc7f6;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_005bc7cb;
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar7 = (**(code **)*puVar2)(puVar2,pVVar12,uVar6,ret);
        puVar2[1] = uVar7;
      }
      pPVar8 = (PClass *)puVar2[1];
      bVar13 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar3 && bVar13) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar13 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar13) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005bc7f6;
      }
    }
  }
  if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
     ((VVar1 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_005bc7f6;
  }
  if ((this->special2 == 0) &&
     (iVar4 = this->health, iVar5 = AActor::SpawnHealth(this), pAVar9 = AActor::TIDHash[0x78],
     iVar4 <= iVar5 / 2)) {
    for (; (pAVar9 != (AActor *)0x0 && (pAVar9->tid != 0xf8)); pAVar9 = pAVar9->inext) {
    }
    if (pAVar9 != (AActor *)0x0) {
      local_40.X = (pAVar9->__Pos).X;
      local_40.Y = (pAVar9->__Pos).Y;
      local_40.Z = -2147483648.0;
      local_60.Degrees = (pAVar9->Angles).Yaw.Degrees;
      P_Teleport(this,&local_40,&local_60,3);
    }
    P_StartScript(this,(line_t *)0x0,0xf9,(char *)0x0,(int *)0x0,0,0);
    this->special2 = 1;
    return 0;
  }
  pAVar9 = (this->target).field_0.p;
  if (pAVar9 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  uVar6 = FRandom::GenRand32(&pr_koraxchase);
  if ((uVar6 & 0xfe) < 0x1e) {
    AActor::SetState(this,this->MissileState,false);
  }
  else {
    uVar6 = FRandom::GenRand32(&pr_koraxchase);
    if ((uVar6 & 0xfe) < 0x1e) {
      local_6c.ID = S_FindSound("KoraxActive");
      S_Sound(this,2,&local_6c,1.0,0.0);
    }
  }
  iVar4 = this->health;
  iVar5 = AActor::SpawnHealth(this);
  if (iVar5 >> 1 <= iVar4) {
    return 0;
  }
  uVar6 = FRandom::GenRand32(&pr_koraxchase);
  if (9 < (uVar6 & 0xfe)) {
    return 0;
  }
  pAVar9 = (this->tracer).field_0.p;
  if (pAVar9 != (AActor *)0x0) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar9 = (AActor *)0x0;
      do {
        ppAVar10 = &pAVar9->inext;
        if (pAVar9 == (AActor *)0x0) {
          ppAVar10 = AActor::TIDHash + 0x79;
        }
        for (pAVar9 = *ppAVar10; (pAVar9 != (AActor *)0x0 && (pAVar9->tid != 0xf9));
            pAVar9 = pAVar9->inext) {
        }
        if (pAVar9 == (AActor *)0x0) break;
        pAVar11 = (this->tracer).field_0.p;
        if ((pAVar11 != (AActor *)0x0) &&
           (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->tracer).field_0.p = (AActor *)0x0;
          pAVar11 = (AActor *)0x0;
        }
      } while (pAVar9 != pAVar11);
      goto LAB_005bc741;
    }
    (this->tracer).field_0.p = (AActor *)0x0;
  }
  pAVar9 = (AActor *)0x0;
LAB_005bc741:
  ppAVar10 = AActor::TIDHash + 0x79;
  if (pAVar9 != (AActor *)0x0) {
    ppAVar10 = &pAVar9->inext;
  }
  for (pAVar9 = *ppAVar10; (pAVar9 != (AActor *)0x0 && (pAVar9->tid != 0xf9));
      pAVar9 = pAVar9->inext) {
  }
  (this->tracer).field_0.p = pAVar9;
  if (pAVar9 != (AActor *)0x0) {
    local_58.X = (pAVar9->__Pos).X;
    local_58.Y = (pAVar9->__Pos).Y;
    local_58.Z = -2147483648.0;
    local_68.Degrees = (pAVar9->Angles).Yaw.Degrees;
    P_Teleport(this,&local_58,&local_68,3);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxChase)
{
	PARAM_ACTION_PROLOGUE;

	AActor *spot;

	if ((!self->special2) && (self->health <= (self->SpawnHealth()/2)))
	{
		FActorIterator iterator (KORAX_FIRST_TELEPORT_TID);
		spot = iterator.Next ();
		if (spot != NULL)
		{
			P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
		}

		P_StartScript (self, NULL, 249, NULL, NULL, 0, 0);
		self->special2 = 1;	// Don't run again

		return 0;
	}

	if (self->target == NULL)
	{
		return 0;
	}
	if (pr_koraxchase()<30)
	{
		self->SetState (self->MissileState);
	}
	else if (pr_koraxchase()<30)
	{
		S_Sound (self, CHAN_VOICE, "KoraxActive", 1, ATTN_NONE);
	}

	// Teleport away
	if (self->health < (self->SpawnHealth()>>1))
	{
		if (pr_koraxchase()<10)
		{
			FActorIterator iterator (KORAX_TELEPORT_TID);

			if (self->tracer != NULL)
			{	// Find the previous teleport destination
				do
				{
					spot = iterator.Next ();
				} while (spot != NULL && spot != self->tracer);
			}

			// Go to the next teleport destination
			spot = iterator.Next ();
			self->tracer = spot;
			if (spot)
			{
				P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
			}
		}
	}
	return 0;
}